

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O1

void Assimp::FBX::ResolveVertexDataArray<aiVector3t<float>>
               (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *data_out,
               Scope *source,string *MappingInformationType,string *ReferenceInformationType,
               char *dataElementName,char *indexDataElementName,size_t vertex_count,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mapping_counts,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mapping_offsets,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mappings)

{
  pointer pcVar1;
  uint uVar2;
  pointer paVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  pointer paVar6;
  _Alloc_hider _Var7;
  bool bVar8;
  float fVar9;
  char *pcVar10;
  Scope *pSVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  Element *pEVar15;
  long lVar16;
  pointer piVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tempData_1;
  vector<int,_std::allocator<int>_> uvIndices;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_229;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_228;
  vector<int,_std::allocator<int>_> local_208;
  char *local_1e8;
  Scope *local_1e0;
  char *local_1d8;
  string *local_1d0;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1d8 = dataElementName;
  iVar13 = std::__cxx11::string::compare((char *)ReferenceInformationType);
  local_1d0 = ReferenceInformationType;
  iVar14 = std::__cxx11::string::compare((char *)ReferenceInformationType);
  local_1e8 = indexDataElementName;
  local_1e0 = source;
  if (iVar14 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,indexDataElementName,&local_229);
    bVar12 = HasElement(source,&local_1c8);
    bVar12 = !bVar12;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar12 = false;
  }
  bVar8 = (bool)(iVar13 == 0 | bVar12);
  iVar13 = std::__cxx11::string::compare((char *)MappingInformationType);
  pcVar10 = local_1d8;
  if ((bVar8) && (iVar13 == 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,local_1d8,(allocator<char> *)&local_258);
    pSVar11 = local_1e0;
    bVar12 = HasElement(local_1e0,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (!bVar12) {
      return;
    }
    local_258._M_dataplus._M_p = (pointer)0x0;
    local_258._M_string_length = 0;
    local_258.field_2._M_allocated_capacity = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,pcVar10,(allocator<char> *)&local_228);
    pEVar15 = GetRequiredElement(pSVar11,(string *)local_1a8,(Element *)0x0);
    ParseVectorDataArray
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&local_258,pEVar15)
    ;
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
              (data_out,vertex_count);
    _Var7._M_p = local_258._M_dataplus._M_p;
    uVar5 = local_258.field_2._M_allocated_capacity;
    if (local_258._M_string_length - (long)local_258._M_dataplus._M_p != 0) {
      lVar16 = ((long)(local_258._M_string_length - (long)local_258._M_dataplus._M_p) >> 2) *
               -0x5555555555555555;
      lVar18 = 0;
      do {
        uVar2 = (mapping_offsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_start[lVar18];
        uVar19 = (ulong)uVar2;
        uVar20 = (mapping_counts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar18] + uVar2;
        if (uVar2 < uVar20) {
          do {
            uVar2 = (mappings->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar19];
            paVar3 = (data_out->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            paVar3[uVar2].z = *(float *)(local_258._M_dataplus._M_p + lVar18 * 0xc + 8);
            uVar4 = *(undefined8 *)(local_258._M_dataplus._M_p + lVar18 * 0xc);
            paVar3 = paVar3 + uVar2;
            paVar3->x = (float)(int)uVar4;
            paVar3->y = (float)(int)((ulong)uVar4 >> 0x20);
            uVar19 = uVar19 + 1;
          } while (uVar20 != uVar19);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != lVar16 + (ulong)(lVar16 == 0));
    }
  }
  else {
    iVar13 = std::__cxx11::string::compare((char *)MappingInformationType);
    if ((iVar14 != 0 || bVar12) || (iVar13 != 0)) {
      iVar13 = std::__cxx11::string::compare((char *)MappingInformationType);
      pcVar10 = local_1d8;
      pSVar11 = local_1e0;
      if (bVar8 && iVar13 == 0) {
        local_258._M_dataplus._M_p = (pointer)0x0;
        local_258._M_string_length = 0;
        local_258.field_2._M_allocated_capacity = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1a8,local_1d8,(allocator<char> *)&local_228);
        pEVar15 = GetRequiredElement(pSVar11,(string *)local_1a8,(Element *)0x0);
        ParseVectorDataArray
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&local_258,
                   pEVar15);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if (((long)(local_258._M_string_length - (long)local_258._M_dataplus._M_p) >> 2) *
            -0x5555555555555555 - vertex_count == 0) {
          _Var7._M_p = (pointer)(data_out->
                                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                )._M_impl.super__Vector_impl_data._M_start;
          paVar3 = (data_out->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          uVar5 = (data_out->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
          (data_out->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_start = (pointer)local_258._M_dataplus._M_p;
          (data_out->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_finish = (pointer)local_258._M_string_length;
          (data_out->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)local_258.field_2._M_allocated_capacity;
          local_258._M_dataplus._M_p = _Var7._M_p;
          local_258._M_string_length = (size_type)paVar3;
          local_258.field_2._M_allocated_capacity = uVar5;
        }
        else {
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[56]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1a8,
                     (char (*) [56])"length of input data unexpected for ByPolygon mapping: ");
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", expected ",0xb)
          ;
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          LogFunctions<Assimp::FBXImporter>::LogError((format *)local_1a8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          _Var7._M_p = local_258._M_dataplus._M_p;
          uVar5 = local_258.field_2._M_allocated_capacity;
        }
        goto joined_r0x0060ec80;
      }
      iVar13 = std::__cxx11::string::compare((char *)MappingInformationType);
      if ((iVar14 != 0 || bVar12) || iVar13 != 0) {
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[60]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
                   ,(char (*) [60])"ignoring vertex data channel, access type not implemented: ");
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(MappingInformationType->_M_dataplus)._M_p,
                   MappingInformationType->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(local_1d0->_M_dataplus)._M_p,local_1d0->_M_string_length);
        LogFunctions<Assimp::FBXImporter>::LogError((format *)local_1a8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        return;
      }
      local_228.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_228.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_228.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,pcVar10,(allocator<char> *)&local_258);
      pEVar15 = GetRequiredElement(pSVar11,(string *)local_1a8,(Element *)0x0);
      pcVar10 = local_1e8;
      ParseVectorDataArray(&local_228,pEVar15);
      pcVar1 = local_1a8 + 0x10;
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                (data_out,vertex_count);
      local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int *)0x0;
      local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,pcVar10,(allocator<char> *)&local_258);
      pEVar15 = GetRequiredElement(pSVar11,(string *)local_1a8,(Element *)0x0);
      ParseVectorDataArray(&local_208,pEVar15);
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2 == vertex_count) {
        if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start !=
            local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish) {
          uVar19 = 0;
          piVar17 = local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            uVar21 = (ulong)*piVar17;
            if (uVar21 == 0xffffffffffffffff) {
              paVar6 = (data_out->
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              paVar3 = paVar6 + uVar19;
              paVar3->x = 0.0;
              paVar3->y = 0.0;
              paVar6[uVar19].z = 0.0;
            }
            else {
              uVar22 = ((long)local_228.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_228.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
              if (uVar22 < uVar21 || uVar22 - uVar21 == 0) {
                local_1a8._0_8_ = pcVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1a8,"index out of range","");
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_258,pcVar10,&local_259);
                pEVar15 = GetRequiredElement(pSVar11,&local_258,(Element *)0x0);
                Util::DOMError((string *)local_1a8,pEVar15);
              }
              paVar3 = (data_out->
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              paVar3[uVar19].z =
                   local_228.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar21].z;
              fVar9 = local_228.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar21].y;
              paVar3 = paVar3 + uVar19;
              paVar3->x = local_228.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar21].x;
              paVar3->y = fVar9;
            }
            uVar19 = (ulong)((int)uVar19 + 1);
            piVar17 = piVar17 + 1;
          } while (piVar17 !=
                   local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        }
      }
      else {
        LogFunctions<Assimp::FBXImporter>::LogError((char *)0x60f073);
      }
    }
    else {
      local_228.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_228.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_228.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,local_1d8,(allocator<char> *)&local_258);
      pSVar11 = local_1e0;
      pEVar15 = GetRequiredElement(local_1e0,(string *)local_1a8,(Element *)0x0);
      ParseVectorDataArray(&local_228,pEVar15);
      pcVar1 = local_1a8 + 0x10;
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                (data_out,vertex_count);
      local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int *)0x0;
      local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,local_1e8,(allocator<char> *)&local_258);
      pEVar15 = GetRequiredElement(pSVar11,(string *)local_1a8,(Element *)0x0);
      ParseVectorDataArray(&local_208,pEVar15);
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        lVar16 = (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2;
        lVar18 = 0;
        do {
          uVar2 = (mapping_offsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                  ._M_impl.super__Vector_impl_data._M_start[lVar18];
          uVar19 = (ulong)uVar2;
          uVar20 = (mapping_counts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                   ._M_impl.super__Vector_impl_data._M_start[lVar18] + uVar2;
          if (uVar2 < uVar20) {
            do {
              uVar21 = (ulong)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar18];
              uVar22 = ((long)local_228.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_228.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
              if (uVar22 < uVar21 || uVar22 - uVar21 == 0) {
                local_1a8._0_8_ = pcVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1a8,"index out of range","");
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_258,local_1e8,&local_259);
                pEVar15 = GetRequiredElement(pSVar11,&local_258,(Element *)0x0);
                Util::DOMError((string *)local_1a8,pEVar15);
              }
              uVar2 = (mappings->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start[uVar19];
              paVar3 = (data_out->
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              paVar3[uVar2].z =
                   local_228.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar21].z;
              fVar9 = local_228.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar21].y;
              paVar3 = paVar3 + uVar2;
              paVar3->x = local_228.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar21].x;
              paVar3->y = fVar9;
              uVar19 = uVar19 + 1;
            } while (uVar20 != uVar19);
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 != lVar16 + (ulong)(lVar16 == 0));
      }
    }
    _Var7._M_p = (pointer)local_228.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = local_228.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
      _Var7._M_p = (pointer)local_228.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = local_228.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
  }
joined_r0x0060ec80:
  if ((pointer)_Var7._M_p != (pointer)0x0) {
    operator_delete(_Var7._M_p,uVar5 - (long)_Var7._M_p);
  }
  return;
}

Assistant:

void ResolveVertexDataArray(std::vector<T>& data_out, const Scope& source,
    const std::string& MappingInformationType,
    const std::string& ReferenceInformationType,
    const char* dataElementName,
    const char* indexDataElementName,
    size_t vertex_count,
    const std::vector<unsigned int>& mapping_counts,
    const std::vector<unsigned int>& mapping_offsets,
    const std::vector<unsigned int>& mappings)
{
    bool isDirect = ReferenceInformationType == "Direct";
    bool isIndexToDirect = ReferenceInformationType == "IndexToDirect";

    // fall-back to direct data if there is no index data element
    if ( isIndexToDirect && !HasElement( source, indexDataElementName ) ) {
        isDirect = true;
        isIndexToDirect = false;
    }

    // handle permutations of Mapping and Reference type - it would be nice to
    // deal with this more elegantly and with less redundancy, but right
    // now it seems unavoidable.
    if (MappingInformationType == "ByVertice" && isDirect) {
        if (!HasElement(source, dataElementName)) {
            return;
        }
        std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);
		for (size_t i = 0, e = tempData.size(); i < e; ++i) {

            const unsigned int istart = mapping_offsets[i], iend = istart + mapping_counts[i];
            for (unsigned int j = istart; j < iend; ++j) {
				data_out[mappings[j]] = tempData[i];
            }
        }
    }
    else if (MappingInformationType == "ByVertice" && isIndexToDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);

        std::vector<int> uvIndices;
        ParseVectorDataArray(uvIndices,GetRequiredElement(source,indexDataElementName));
        for (size_t i = 0, e = uvIndices.size(); i < e; ++i) {

            const unsigned int istart = mapping_offsets[i], iend = istart + mapping_counts[i];
            for (unsigned int j = istart; j < iend; ++j) {
				if (static_cast<size_t>(uvIndices[i]) >= tempData.size()) {
                    DOMError("index out of range",&GetRequiredElement(source,indexDataElementName));
                }
				data_out[mappings[j]] = tempData[uvIndices[i]];
            }
        }
    }
    else if (MappingInformationType == "ByPolygonVertex" && isDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

		if (tempData.size() != vertex_count) {
            FBXImporter::LogError(Formatter::format("length of input data unexpected for ByPolygon mapping: ")
				<< tempData.size() << ", expected " << vertex_count
            );
            return;
        }

		data_out.swap(tempData);
    }
    else if (MappingInformationType == "ByPolygonVertex" && isIndexToDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);

        std::vector<int> uvIndices;
        ParseVectorDataArray(uvIndices,GetRequiredElement(source,indexDataElementName));

        if (uvIndices.size() != vertex_count) {
            FBXImporter::LogError("length of input data unexpected for ByPolygonVertex mapping");
            return;
        }

        const T empty;
        unsigned int next = 0;
        for(int i : uvIndices) {
            if ( -1 == i ) {
                data_out[ next++ ] = empty;
                continue;
            }
            if (static_cast<size_t>(i) >= tempData.size()) {
                DOMError("index out of range",&GetRequiredElement(source,indexDataElementName));
            }

			data_out[next++] = tempData[i];
        }
    }
    else {
        FBXImporter::LogError(Formatter::format("ignoring vertex data channel, access type not implemented: ")
            << MappingInformationType << "," << ReferenceInformationType);
    }
}